

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_mergable.cpp
# Opt level: O3

void __thiscall
cpp_client::Delta_mergable::Delta_mergable
          (Delta_mergable *this,
          initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
          init)

{
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cpp_client::Any>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  undefined8 *puVar2;
  long lVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
  *puVar4;
  long lVar5;
  iterator ppVar6;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40;
  unique_ptr<cpp_client::Delta_mergable_delay_variables,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
  *local_38;
  
  ppVar6 = init._M_array;
  this->_vptr_Delta_mergable = (_func_int **)&PTR___cxa_pure_virtual_00139660;
  puVar4 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
            *)operator_new(0x38);
  *(undefined8 *)&(puVar4->_M_h)._M_rehash_policy = 0;
  *(size_t *)((long)&(puVar4->_M_h)._M_rehash_policy + 8) = 0;
  (puVar4->_M_h)._M_buckets = &(puVar4->_M_h)._M_single_bucket;
  (puVar4->_M_h)._M_bucket_count = 1;
  (puVar4->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (puVar4->_M_h)._M_element_count = 0;
  (puVar4->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  *(size_t *)((long)&(puVar4->_M_h)._M_rehash_policy + 8) = 0;
  (puVar4->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (this->variable_storage_)._M_t.
  super___uniq_ptr_impl<cpp_client::Delta_mergable_delay_variables,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
  ._M_t.
  super__Tuple_impl<0UL,_cpp_client::Delta_mergable_delay_variables_*,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
  .super__Head_base<0UL,_cpp_client::Delta_mergable_delay_variables_*,_false>._M_head_impl =
       (Delta_mergable_delay_variables *)puVar4;
  this->variables_ = puVar4;
  if (init._M_len != 0) {
    local_38 = &this->variable_storage_;
    lVar5 = 0;
    do {
      p_Var1 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cpp_client::Any>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this->variables_;
      puVar2 = *(undefined8 **)((long)&ppVar6->second + lVar5);
      local_60[0] = local_50;
      lVar3 = *(long *)((long)&(ppVar6->first)._M_dataplus._M_p + lVar5);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,lVar3,
                 *(long *)((long)&(ppVar6->first)._M_string_length + lVar5) + lVar3);
      local_40 = (long *)*puVar2;
      *puVar2 = 0;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cpp_client::Any>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,cpp_client::Any>>(p_Var1,(string *)local_60);
      if (local_40 != (long *)0x0) {
        (**(code **)(*local_40 + 8))();
      }
      local_40 = (long *)0x0;
      if (local_60[0] != local_50) {
        operator_delete(local_60[0]);
      }
      lVar5 = lVar5 + 0x28;
    } while (init._M_len * 0x28 != lVar5);
  }
  return;
}

Assistant:

Delta_mergable::Delta_mergable(std::initializer_list<std::pair<std::string, Any&&>> init) :
   variable_storage_(new Delta_mergable_delay_variables{}),
   variables_(variable_storage_->variables_)
{
   for(auto&& obj : init)
   {
      variables_.emplace(std::make_pair(std::move(obj.first), std::move(obj.second)));
   }
}